

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O0

void __thiscall
jessilib::impl_join::
join_mb_append<char32_t,std::basic_string_view<char8_t,std::char_traits<char8_t>>>
          (impl_join *this,string *out_string,char32_t *in_string,
          basic_string_view<char8_t,_std::char_traits<char8_t>_> *in_args)

{
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_string_00;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> local_58;
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> *local_20;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> *in_args_local;
  char32_t *in_string_local;
  string *out_string_local;
  
  local_20 = (basic_string_view<char8_t,_std::char_traits<char8_t>_> *)in_string;
  in_args_local = (basic_string_view<char8_t,_std::char_traits<char8_t>_> *)out_string;
  in_string_local = (char32_t *)this;
  std::basic_string_view<char32_t,_std::char_traits<char32_t>_>::basic_string_view
            (&local_58,(char32_t *)out_string,1);
  in_string_00._M_str = (char32_t *)in_args;
  in_string_00._M_len = (size_t)local_58._M_str;
  ustring_to_mbstring<char32_t>(&local_48,(jessilib *)local_58._M_len,in_string_00);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_string_local,
             &local_48.second);
  std::pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_48);
  join_mb_append<std::basic_string_view<char8_t,std::char_traits<char8_t>>>
            ((string *)in_string_local,local_20);
  return;
}

Assistant:

void join_mb_append(std::string& out_string, InT&& in_string, ArgsT&&... in_args) {
	// TODO: is this a valid approach? is mbstate fine it discard between appends?
	if constexpr (std::is_same_v<char32_t, InT>) {
		out_string += ustring_to_mbstring(std::u32string_view{ &in_string, 1 }).second;
	}
	else {
		out_string += ustring_to_mbstring(in_string).second;
	}

	join_mb_append(out_string, std::forward<ArgsT>(in_args)...);
}